

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.h
# Opt level: O0

void __thiscall
di::Context::addFactoryPriv<T5_d>(Context *this,FactoryFunction<T5_d> factoryFunction)

{
  bool bVar1;
  runtime_error *this_00;
  anon_class_16_2_9ea09bd3 local_90;
  undefined1 local_7d;
  allocator local_69;
  string local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [32];
  mapped_type *local_28;
  CtxItem *item;
  type_index instanceTypeIdx;
  FactoryFunction<T5_d> factoryFunction_local;
  Context *this_local;
  
  instanceTypeIdx._M_target = (type_info *)factoryFunction;
  std::type_index::type_index((type_index *)&item,(type_info *)&T5_d::typeinfo);
  declareBaseTypes<T5_d,_nullptr>(this,(type_index *)&item);
  local_28 = std::
             map<std::type_index,_di::Context::CtxItem,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_di::Context::CtxItem>_>_>
             ::operator[](&this->items,(key_type *)&item);
  bVar1 = std::function::operator_cast_to_bool((function *)&local_28->factory);
  if (!bVar1) {
    local_90.factoryFunction = (FactoryFunction<T5_d>)instanceTypeIdx._M_target;
    local_90.this = this;
    std::function<void()>::operator=((function<void()> *)&local_28->factory,&local_90);
    return;
  }
  local_7d = 1;
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"Factory already registed for type: ",&local_69);
  std::type_info::name((type_info *)&T5_d::typeinfo);
  std::operator+(local_48,(char *)local_68);
  std::runtime_error::runtime_error(this_00,(string *)local_48);
  local_7d = 0;
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void addFactoryPriv(FactoryFunction<InstanceType, Args...> factoryFunction)
    {
        auto instanceTypeIdx = std::type_index(typeid(InstanceType));

#ifdef HAS_TR2
        declareBaseTypes< typename std::tr2::bases<InstanceType>::type >( instanceTypeIdx );
#else
        declareBaseTypes<InstanceType>( instanceTypeIdx );
#endif

        CtxItem& item = items[ instanceTypeIdx ];

        if (item.factory)
            throw std::runtime_error(std::string("Factory already registed for type: ") + typeid(InstanceType).name());

        item.factory = [factoryFunction, this]()
        {
            addInstance(factoryFunction( get<Args>()... ), true);
        };
    }